

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall GraphPropagator::fullExpl(GraphPropagator *this,vec<Lit> *ps)

{
  uint uVar1;
  uint uVar2;
  undefined8 in_RAX;
  char *pcVar3;
  long lVar4;
  long lVar5;
  undefined8 local_38;
  
  uVar2 = (this->vs).sz;
  local_38 = in_RAX;
  if (0 < (int)uVar2) {
    lVar5 = 8;
    lVar4 = 0;
    pcVar3 = sat.assigns.data;
    do {
      uVar1 = *(uint *)((long)&(((this->vs).data)->super_Var).super_Branching._vptr_Branching +
                       lVar5);
      if (pcVar3[uVar1] != 0) {
        local_38 = CONCAT44((uint)((byte)pcVar3[uVar1] < 0xfe) + uVar1 * 2,local_38._0_4_);
        vec<Lit>::push(ps,(Lit *)((long)&local_38 + 4));
        uVar2 = (this->vs).sz;
        pcVar3 = sat.assigns.data;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < (int)uVar2);
  }
  uVar2 = (this->es).sz;
  if (0 < (int)uVar2) {
    lVar5 = 8;
    lVar4 = 0;
    pcVar3 = sat.assigns.data;
    do {
      uVar1 = *(uint *)((long)&(((this->es).data)->super_Var).super_Branching._vptr_Branching +
                       lVar5);
      if (pcVar3[uVar1] != 0) {
        local_38 = CONCAT44(local_38._4_4_,(uint)((byte)pcVar3[uVar1] < 0xfe) + uVar1 * 2);
        vec<Lit>::push(ps,(Lit *)&local_38);
        uVar2 = (this->es).sz;
        pcVar3 = sat.assigns.data;
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (lVar4 < (int)uVar2);
  }
  return;
}

Assistant:

void GraphPropagator::fullExpl(vec<Lit>& ps) {
	for (int i = 0; i < nbNodes(); i++) {
		if (getNodeVar(i).isFixed()) {
			ps.push(getNodeVar(i).getValLit());
		}
	}
	for (int i = 0; i < nbEdges(); i++) {
		if (getEdgeVar(i).isFixed()) {
			ps.push(getEdgeVar(i).getValLit());
		}
	}
}